

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O1

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (ret->data != (Qiniu_CDN_FluxData *)0x0) {
    if (0 < ret->domainsCount) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        pvVar1 = *(void **)((long)&ret->data->china + lVar2);
        if (pvVar1 != (void *)0x0) {
          Qiniu_Free(pvVar1);
        }
        pvVar1 = *(void **)((long)&ret->data->oversea + lVar2);
        if (pvVar1 != (void *)0x0) {
          Qiniu_Free(pvVar1);
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x28;
      } while (lVar3 < ret->domainsCount);
    }
    Qiniu_Free(ret->data);
    return;
  }
  return;
}

Assistant:

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret) {
    int i;

    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; ++i) {
            if (ret->data[i].china != NULL) {
                Qiniu_Free(ret->data[i].china);
            }
            if (ret->data[i].oversea != NULL) {
                Qiniu_Free(ret->data[i].oversea);
            }
        }
        Qiniu_Free(ret->data);
    }
}